

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

void sbs_substr(sbstring *sbs,ptrdiff_t pos,size_t len)

{
  ulong uVar1;
  size_t sz;
  size_t len_local;
  ptrdiff_t pos_local;
  sbstring *sbs_local;
  
  if ((long)sbs->end - (long)sbs->begin < pos) {
    sbs->end = sbs->begin;
  }
  if (-1 < pos) {
    uVar1 = (long)sbs->end - (long)(sbs->begin + pos);
    sz = len;
    if (uVar1 < len) {
      sz = uVar1;
    }
    if (sz == pos) {
      memcpy(sbs->begin,sbs->begin + pos,sz);
    }
    else {
      memmove(sbs->begin,sbs->begin + pos,sz);
    }
    sbs->end = sbs->begin + sz;
    *sbs->end = '\0';
  }
  return;
}

Assistant:

void sbs_substr(sbstring *sbs, ptrdiff_t pos, size_t len)
{
    if (pos > sbs->end - sbs->begin) {
        /* starting past end of string, do nothing */
        sbs->end = sbs->begin;
    }
    if (pos >= 0) {
        size_t sz = sbs->end - (sbs->begin + pos);
        if (len > sz) len = sz;
        if (len - pos > 0) {
            memmove(sbs->begin, sbs->begin + pos, len);
        }
        else {
            memcpy(sbs->begin, sbs->begin + pos, len);
        }
        sbs->end = sbs->begin + len;
        sbs->end[0] = '\0';
    }
}